

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O2

void __thiscall QAbstractButtonPrivate::fixFocusPolicy(QAbstractButtonPrivate *this)

{
  QWidget *pQVar1;
  QWidget *this_00;
  FocusPolicy FVar2;
  int i;
  undefined1 *puVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractButton_*> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  if ((this->group != (QButtonGroup *)0x0) || ((this->field_0x28c & 8) != 0)) {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
    queryButtonList((QList<QAbstractButton_*> *)&local_38,this);
    for (puVar3 = (undefined1 *)0x0; puVar3 < (ulong)local_38.size; puVar3 = puVar3 + 1) {
      this_00 = &local_38.ptr[(long)puVar3]->super_QWidget;
      if ((*(byte *)(*(long *)&this_00->field_0x8 + 0x28c) & 1) != 0) {
        if ((this_00 == pQVar1) || ((*(byte *)(*(long *)&pQVar1->field_0x8 + 0x28c) & 1) == 0)) {
          FVar2 = QWidget::focusPolicy(this_00);
          FVar2 = FVar2 | TabFocus;
        }
        else {
          FVar2 = QWidget::focusPolicy(this_00);
          FVar2 = FVar2 & ~TabFocus;
        }
        QWidget::setFocusPolicy(this_00,FVar2);
      }
    }
    QArrayDataPointer<QAbstractButton_*>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButtonPrivate::fixFocusPolicy()
{
    Q_Q(QAbstractButton);
#if QT_CONFIG(buttongroup)
    if (!group && !autoExclusive)
#else
    if (!autoExclusive)
#endif
        return;

    QList<QAbstractButton *> buttonList = queryButtonList();
    for (int i = 0; i < buttonList.size(); ++i) {
        QAbstractButton *b = buttonList.at(i);
        if (!b->isCheckable())
            continue;
        b->setFocusPolicy((Qt::FocusPolicy) ((b == q || !q->isCheckable())
                                         ? (b->focusPolicy() | Qt::TabFocus)
                                         :  (b->focusPolicy() & ~Qt::TabFocus)));
    }
}